

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::ResetNotificationStrategy::LoseContextOnResetCase::iterate(LoseContextOnResetCase *this)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  int local_1b8 [4];
  MessageBuilder local_1a8;
  long local_28;
  Functions *gl;
  LoseContextOnResetCase *pLStack_18;
  GLint reset;
  LoseContextOnResetCase *this_local;
  
  pLStack_18 = this;
  bVar1 = checkExtension((this->super_RobustnessBase).super_TestCase.m_context,"GL_KHR_robustness");
  if (bVar1) {
    RobustnessBase::createRobustContext
              (&this->super_RobustnessBase,RESET_NOTIFICATION_STRATEGY_LOSE_CONTEXT_ON_RESET);
    pRVar3 = RobustnessBase::getRobustContext(&this->super_RobustnessBase);
    (*pRVar3->_vptr_RenderContext[8])();
    gl._4_4_ = 0;
    pRVar3 = RobustnessBase::getRobustContext(&this->super_RobustnessBase);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    local_28 = CONCAT44(extraout_var,iVar2);
    (**(code **)(local_28 + 0x868))(0x8256,(long)&gl + 4);
    err = (**(code **)(local_28 + 0x800))();
    glu::checkError(err,"glGetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                    ,0xba);
    if (gl._4_4_ == 0x8252) {
      RobustnessBase::releaseRobustContext(&this->super_RobustnessBase);
      pRVar3 = deqp::Context::getRenderContext
                         ((this->super_RobustnessBase).super_TestCase.m_context);
      (*pRVar3->_vptr_RenderContext[8])();
      tcu::TestContext::setTestResult
                ((this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                 ,QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      this_00 = tcu::TestContext::getLog
                          ((this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode
                           .m_testCtx);
      tcu::TestLog::operator<<(&local_1a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_1a8,(char (*) [42])"Test failed! glGet returned wrong value [");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)((long)&gl + 4));
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [12])0x2c16365);
      local_1b8[0] = 0x8252;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1b8);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2aea36f);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1a8);
      tcu::TestContext::setTestResult
                ((this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                 ,QP_TEST_RESULT_FAIL,"Fail");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

virtual IterateResult iterate(void)
	{
		if (!checkExtension(m_context, "GL_KHR_robustness"))
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
			return STOP;
		}

		createRobustContext(glu::RESET_NOTIFICATION_STRATEGY_LOSE_CONTEXT_ON_RESET);
		getRobustContext()->makeCurrent();

		glw::GLint reset = 0;

		const glw::Functions& gl = getRobustContext()->getFunctions();
		gl.getIntegerv(GL_RESET_NOTIFICATION_STRATEGY, &reset);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv");

		if (reset != GL_LOSE_CONTEXT_ON_RESET)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Test failed! glGet returned wrong value [" << reset
							   << ", expected " << GL_LOSE_CONTEXT_ON_RESET << "]." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		releaseRobustContext();
		m_context.getRenderContext().makeCurrent();

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}